

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
CGL::Application::draw_string(Application *this,float x,float y,string *str,size_t size,Color *c)

{
  int iVar1;
  undefined8 *in_RCX;
  string *in_RSI;
  int line_index;
  string *this_00;
  undefined4 in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff9c;
  string local_50 [8];
  Color in_stack_ffffffffffffffb8;
  
  this_00 = local_50;
  std::__cxx11::string::string(this_00,in_RSI);
  iVar1 = OSDText::add_line((OSDText *)*in_RCX,in_stack_ffffffffffffff9c,*(float *)(in_RCX + 1),
                            (string *)*in_RCX,in_stack_ffffffffffffff88,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_50);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_ffffffffffffff30),
             (value_type_conflict3 *)this_00);
  return;
}

Assistant:

inline void Application::draw_string(float x, float y,
  string str, size_t size, const Color& c) {
  int line_index = textManager.add_line(( x * 2 / screenW) - 1.0,
                                        (-y * 2 / screenH) + 1.0,
                                        str, size, c);
  messages.push_back(line_index);
}